

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall problem_parser::problem_parser(problem_parser *this)

{
  shared_ptr<baryonyx::string_buffer> local_20;
  problem_parser *local_10;
  problem_parser *this_local;
  
  local_10 = this;
  baryonyx::raw_problem::raw_problem(&this->m_problem);
  std::
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::unordered_map(&this->m_cache_variable);
  std::make_shared<baryonyx::string_buffer>();
  std::shared_ptr<baryonyx::string_buffer>::operator=
            ((shared_ptr<baryonyx::string_buffer> *)this,&local_20);
  std::shared_ptr<baryonyx::string_buffer>::~shared_ptr(&local_20);
  return;
}

Assistant:

problem_parser()
    {
        m_problem.strings = std::make_shared<baryonyx::string_buffer>();
    }